

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Psbt::GetTxInCount(Psbt *this)

{
  undefined8 uVar1;
  string *in_stack_ffffffffffffff50;
  string *message;
  CfdError in_stack_ffffffffffffff5c;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff60;
  CfdSourceLocation local_80;
  undefined1 local_65;
  undefined1 local_51 [33];
  CfdSourceLocation local_30;
  void *local_18;
  wally_psbt *psbt_pointer;
  Psbt *this_local;
  
  local_18 = this->wally_psbt_pointer_;
  psbt_pointer = (wally_psbt *)this;
  if (local_18 == (void *)0x0) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x871;
    local_30.funcname = "GetTxInCount";
    logger::warn<>(&local_30,"psbt pointer is null");
    local_65 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    message = (string *)local_51;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_51 + 1),"psbt pointer is null.",(allocator *)message);
    CfdException::CfdException(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,message);
    local_65 = 0;
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(long *)((long)local_18 + 8) == 0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x874;
    local_80.funcname = "GetTxInCount";
    logger::warn<>(&local_80,"psbt base tx is null");
    error_code = CONCAT13(SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0),
                          CONCAT12(1,(short)in_stack_ffffffffffffff5c));
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff60,"psbt base tx is null.",
               (allocator *)&stack0xffffffffffffff5f);
    CfdException::CfdException(in_stack_ffffffffffffff60,error_code,in_stack_ffffffffffffff50);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return (uint32_t)*(undefined8 *)(*(long *)((long)local_18 + 8) + 0x10);
}

Assistant:

uint32_t Psbt::GetTxInCount() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(kCfdIllegalStateError, "psbt base tx is null.");
  }
  return static_cast<uint32_t>(psbt_pointer->tx->num_inputs);
}